

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::csv::
basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::write_string_value
          (basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,string_view_type *value,string_type *str)

{
  size_t __n;
  char_type *__s;
  bool bVar1;
  char_type *pcVar2;
  
  __n = value->_M_len;
  __s = value->_M_str;
  if (1 < this->quote_style_ - 1) {
    if (this->quote_style_ != minimal) {
LAB_00285e97:
      bVar1 = false;
      goto LAB_00285e99;
    }
    pcVar2 = std::char_traits<char>::find(__s,__n,&this->field_delimiter_);
    if (pcVar2 == (char_type *)0x0) {
      pcVar2 = std::char_traits<char>::find(__s,__n,&this->quote_char_);
      if (pcVar2 == (char_type *)0x0) goto LAB_00285e97;
    }
  }
  std::__cxx11::string::push_back((char)str);
  bVar1 = true;
LAB_00285e99:
  escape_string(this,__s,__n,this->quote_char_,this->quote_escape_char_,str);
  if (bVar1) {
    std::__cxx11::string::push_back((char)str);
    return;
  }
  return;
}

Assistant:

void write_string_value(const string_view_type& value, string_type& str)
    {
        const char* s = value.data();
        const std::size_t length = value.length();
        
        bool quote = false;
        if (quote_style_ == quote_style_kind::all || quote_style_ == quote_style_kind::nonnumeric ||
            (quote_style_ == quote_style_kind::minimal &&
            (std::char_traits<CharT>::find(s, length, field_delimiter_) != nullptr || std::char_traits<CharT>::find(s, length, quote_char_) != nullptr)))
        {
            quote = true;
            str.push_back(quote_char_);
        }
        escape_string(s, length, quote_char_, quote_escape_char_, str);
        if (quote)
        {
            str.push_back(quote_char_);
        }
    }